

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_reporter.h
# Opt level: O0

void __thiscall bandit::detail::info_reporter::it_starting(info_reporter *this,char *desc)

{
  ostream *poVar1;
  char *pcVar2;
  _List_node_base *local_18;
  char *desc_local;
  info_reporter *this_local;
  
  local_18 = (_List_node_base *)desc;
  desc_local = (char *)this;
  progress_reporter::it_starting(&this->super_progress_reporter,desc);
  poVar1 = this->stm_;
  indent_abi_cxx11_((info_reporter *)&stack0xffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,(string *)&stack0xffffffffffffffc8);
  pcVar2 = colorizer::yellow(this->colorizer_);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"[ TEST ]");
  pcVar2 = colorizer::reset(this->colorizer_);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," it ");
  std::operator<<(poVar1,(char *)local_18);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  this->indentation_ = this->indentation_ + 1;
  std::ostream::flush();
  return;
}

Assistant:

virtual void it_starting(const char *desc)
	{
		progress_reporter::it_starting(desc);
		stm_
		  << indent()
		  << colorizer_.yellow()
		  << "[ TEST ]"
		  << colorizer_.reset()
		  << " it " << desc;
		++indentation_;
		stm_.flush();
	}